

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r4.h
# Opt level: O0

int sort_5_4::merge_sort_1(int *a,int low,int high)

{
  code *pcVar1;
  int high_00;
  int mid;
  int high_local;
  int low_local;
  int *a_local;
  
  if (low < high) {
    high_00 = (low + high) / 2;
    merge_sort_1(a,low,high_00);
    merge_sort_1(a,high_00 + 1,high);
    merge_1(a,high_00,low,high);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

int merge_sort_1(int *a, int low, int high) {
        if (low < high) {
            int mid = (low + high) / 2;
            merge_sort_1(a, low, mid);
            merge_sort_1(a, mid + 1, high);
            merge_1(a, mid, low, high);
        }
    }